

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QCollapsibleFrame.cpp
# Opt level: O1

void __thiscall QCollapsibleFrame::setTitle(QCollapsibleFrame *this,QWidget *title)

{
  Data *pDVar1;
  QCollapsibleFramePrivate *pQVar2;
  bool toggled;
  QWidget *pQVar3;
  QWeakPointer<QObject> local_30;
  
  pDVar1 = (this->d->title).wp.d;
  if ((pDVar1 == (Data *)0x0) || (*(int *)(pDVar1 + 4) == 0)) {
    pQVar3 = (QWidget *)0x0;
  }
  else {
    pQVar3 = (QWidget *)(this->d->title).wp.value;
  }
  if (pQVar3 != title) {
    takeTitle(this);
    if (title != (QWidget *)0x0) {
      pQVar2 = this->d;
      local_30.d = (Data *)QtSharedPointer::ExternalRefCountData::getAndRef((QObject *)title);
      local_30.value = (QObject *)title;
      QWeakPointer<QObject>::operator=(&(pQVar2->title).wp,&local_30);
      pDVar1 = local_30.d;
      if (local_30.d != (ExternalRefCountData *)0x0) {
        LOCK();
        *(int *)local_30.d = *(int *)local_30.d + -1;
        UNLOCK();
        if ((*(int *)local_30.d == 0) && (local_30.d != (ExternalRefCountData *)0x0)) {
          QtSharedPointer::ExternalRefCountData::~ExternalRefCountData(local_30.d);
          operator_delete(pDVar1);
        }
      }
      QBoxLayout::addWidget(this->d->horizontalLayout,title,1,0);
      pQVar2 = this->d;
      toggled = (bool)QAbstractButton::isChecked();
      QCollapsibleFramePrivate::button_toggled(pQVar2,toggled);
    }
    titleChanged(this);
  }
  return;
}

Assistant:

void QCollapsibleFrame::setTitle(QWidget *title) {
    if (d->title != title) {
        /*delete*/ takeTitle();

        if (title) {
            d->title = title;
            d->horizontalLayout->addWidget(title, 1);
            d->button_toggled(d->button->isChecked());
        }

        Q_EMIT titleChanged();
    }
}